

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.hpp
# Opt level: O2

void __thiscall duckdb::CSVError::~CSVError(CSVError *this)

{
  ::std::__cxx11::string::~string((string *)&this->csv_row);
  ::std::__cxx11::string::~string((string *)&this->full_error_message);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CSVError() {}